

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedReadsDatastore.cc
# Opt level: O1

vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
* __thiscall
LinkedReadsDatastore::get_tag_readcount
          (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           *__return_storage_ptr__,LinkedReadsDatastore *this)

{
  uint *puVar1;
  uint *t;
  pointer puVar2;
  value_type curr_tag;
  uint32_t curr_count;
  uint local_30;
  uint local_2c;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar2 = (this->read_tag).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_30 = *puVar2;
  local_2c = 0;
  puVar1 = (this->read_tag).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar2 != puVar1) {
    do {
      if (*puVar2 != local_30) {
        if (local_30 != 0) {
          std::
          vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
          ::emplace_back<unsigned_int&,unsigned_int&>
                    ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                      *)__return_storage_ptr__,&local_30,&local_2c);
        }
        local_2c = 0;
        local_30 = *puVar2;
      }
      local_2c = local_2c + 1;
      puVar2 = puVar2 + 1;
    } while (puVar2 != puVar1);
  }
  if (local_30 != 0) {
    std::
    vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
    ::emplace_back<unsigned_int&,unsigned_int&>
              ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                *)__return_storage_ptr__,&local_30,&local_2c);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<LinkedTag, uint32_t>> LinkedReadsDatastore::get_tag_readcount() {
    std::vector<std::pair<LinkedTag, uint32_t>> readcount;
    auto curr_tag=read_tag[0];
    uint32_t curr_count=0;
    for (auto &t:read_tag){
        if (t!=curr_tag){
            if (curr_tag!=0) readcount.emplace_back(curr_tag,curr_count);
            curr_count=0;
            curr_tag=t;
        }
        ++curr_count;
    }
    if (curr_tag!=0) readcount.emplace_back(curr_tag,curr_count);
    return readcount;
}